

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node48.cpp
# Opt level: O1

void duckdb::Node48::Free(ART *art,Node *node)

{
  ulong uVar1;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var2;
  type paVar3;
  long *plVar4;
  pointer this;
  data_ptr_t pdVar5;
  __hash_code __code;
  ulong uVar6;
  long *plVar7;
  idx_t i;
  long lVar8;
  long lVar9;
  
  uVar1 = (node->super_IndexPointer).data;
  paVar3 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var2._M_head_impl =
       paVar3->_M_elems[4].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  uVar6 = uVar1 & 0xffffffff;
  plVar4 = *(long **)(*(long *)&((_Var2._M_head_impl)->buffers)._M_h +
                     (uVar6 % *(size_type *)((long)&(_Var2._M_head_impl)->buffers + 8)) * 8);
  for (plVar7 = (long *)*plVar4; uVar6 != plVar7[1]; plVar7 = (long *)*plVar7) {
    plVar4 = plVar7;
  }
  this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
         operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     *)(*plVar4 + 0x10));
  pdVar5 = FixedSizeBuffer::Get(this,true);
  lVar9 = (ulong)((uint)(uVar1 >> 0x20) & 0xffffff) * (_Var2._M_head_impl)->segment_size;
  if (pdVar5[(_Var2._M_head_impl)->bitmask_offset + lVar9] != '\0') {
    lVar9 = (_Var2._M_head_impl)->bitmask_offset + lVar9;
    lVar8 = 0;
    do {
      if ((ulong)pdVar5[lVar8 + lVar9 + 1] != 0x30) {
        Node::Free(art,(Node *)(pdVar5 + (ulong)pdVar5[lVar8 + lVar9 + 1] * 8 + lVar9 + 0x108));
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x100);
  }
  return;
}

Assistant:

void Node48::Free(ART &art, Node &node) {
	auto &n48 = Node::Ref<Node48>(art, node, NODE_48);
	if (!n48.count) {
		return;
	}

	Iterator(n48, [&](Node &child) { Node::Free(art, child); });
}